

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_array.cpp
# Opt level: O2

void __thiscall
SparseArray_IndexInitializationListCtorCheck_Test<pstore::uint128>::TestBody
          (SparseArray_IndexInitializationListCtorCheck_Test<pstore::uint128> *this)

{
  uint128 *puVar1;
  __uniq_ptr_data<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_>,_true,_true>
  this_00;
  reference pvVar2;
  uint uVar3;
  unsigned_long *in_RCX;
  unsigned_long *in_RDX;
  undefined8 extraout_RDX;
  unsigned_long *first;
  undefined8 extraout_RDX_00;
  pointer *__ptr;
  char *pcVar4;
  Message local_48;
  AssertHelper local_40;
  AssertionResult gtest_ar;
  unique_ptr<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_>_>
  arrp;
  unsigned_long *last;
  
  (anonymous_namespace)::ctor_counter::ctors = 0;
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x2;
  puVar1 = pstore::sparse_array<(anonymous_namespace)::ctor_counter,pstore::uint128>::
           bitmap<unsigned_long_const*,void>
                     ((uint128 *)&gtest_ar,
                      (sparse_array<(anonymous_namespace)::ctor_counter,pstore::uint128> *)&arrp,
                      in_RDX,in_RCX);
  uVar3 = (int)POPCOUNT(extraout_RDX) + (int)POPCOUNT(puVar1) +
          (uint)((int)POPCOUNT(extraout_RDX) + (int)POPCOUNT(puVar1) == 0);
  last = (unsigned_long *)(ulong)uVar3;
  this_00.
  super___uniq_ptr_impl<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_*,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_>_>
  .
  super__Head_base<0UL,_pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_impl<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_>_>
        )operator_new((ulong)(uVar3 * 4 + 0x1c));
  puVar1 = pstore::sparse_array<(anonymous_namespace)::ctor_counter,pstore::uint128>::
           bitmap<unsigned_long_const*,void>
                     ((uint128 *)&gtest_ar,
                      (sparse_array<(anonymous_namespace)::ctor_counter,pstore::uint128> *)&arrp,
                      first,last);
  *(uint128 **)
   this_00.
   super___uniq_ptr_impl<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_*,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_>_>
   .
   super__Head_base<0UL,_pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_*,_false>
   ._M_head_impl = puVar1;
  *(undefined8 *)
   ((long)this_00.
          super___uniq_ptr_impl<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_*,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_>_>
          .
          super__Head_base<0UL,_pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_*,_false>
          ._M_head_impl + 8) = extraout_RDX_00;
  ((ctor_counter *)
  ((long)this_00.
         super___uniq_ptr_impl<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_*,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_>_>
         .
         super__Head_base<0UL,_pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_*,_false>
         ._M_head_impl + 0x10))->v = (anonymous_namespace)::ctor_counter::ctors;
  *(uint *)((long)this_00.
                  super___uniq_ptr_impl<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_*,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_>_>
                  .
                  super__Head_base<0UL,_pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_*,_false>
                  ._M_head_impl + 0x14) = (anonymous_namespace)::ctor_counter::ctors + 1;
  *(uint *)((long)this_00.
                  super___uniq_ptr_impl<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_*,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_>_>
                  .
                  super__Head_base<0UL,_pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_*,_false>
                  ._M_head_impl + 0x18) = (anonymous_namespace)::ctor_counter::ctors + 2;
  (anonymous_namespace)::ctor_counter::ctors = (anonymous_namespace)::ctor_counter::ctors + 3;
  arrp._M_t.
  super___uniq_ptr_impl<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_*,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_>_>
  .
  super__Head_base<0UL,_pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_>,_true,_true>
        )(__uniq_ptr_data<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_>,_true,_true>
          )this_00.
           super___uniq_ptr_impl<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_*,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_>_>
           .
           super__Head_base<0UL,_pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_*,_false>
           ._M_head_impl;
  pvVar2 = pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>::operator[]
                     ((sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128> *)
                      this_00.
                      super___uniq_ptr_impl<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_*,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_>_>
                      .
                      super__Head_base<0UL,_pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_*,_false>
                      ._M_head_impl,0);
  local_48.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"arr[0].v","0U",&pvVar2->v,(uint *)&local_48);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(&local_48);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sparse_array.cpp"
               ,0x92,pcVar4);
    testing::internal::AssertHelper::operator=(&local_40,&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((long *)CONCAT44(local_48.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_48.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_48.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_48.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  pvVar2 = pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>::operator[]
                     ((sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128> *)
                      this_00.
                      super___uniq_ptr_impl<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_*,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_>_>
                      .
                      super__Head_base<0UL,_pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_*,_false>
                      ._M_head_impl,2);
  local_48.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"arr[2].v","1U",&pvVar2->v,(uint *)&local_48);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(&local_48);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sparse_array.cpp"
               ,0x93,pcVar4);
    testing::internal::AssertHelper::operator=(&local_40,&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((long *)CONCAT44(local_48.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_48.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_48.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_48.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  pvVar2 = pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>::operator[]
                     ((sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128> *)
                      this_00.
                      super___uniq_ptr_impl<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_*,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_>_>
                      .
                      super__Head_base<0UL,_pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_*,_false>
                      ._M_head_impl,4);
  local_48.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"arr[4].v","2U",&pvVar2->v,(uint *)&local_48);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(&local_48);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sparse_array.cpp"
               ,0x94,pcVar4);
    testing::internal::AssertHelper::operator=(&local_40,&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((long *)CONCAT44(local_48.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_48.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_48.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_48.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::
  unique_ptr<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>,_std::default_delete<pstore::sparse_array<(anonymous_namespace)::ctor_counter,_pstore::uint128>_>_>
  ::~unique_ptr(&arrp);
  return;
}

Assistant:

TYPED_TEST (SparseArray, IndexInitializationListCtorCheck) {
    ctor_counter::ctors = 0;

    auto arrp = sparse_array<ctor_counter, TypeParam>::make_unique ({0, 2, 4});
    auto & arr = *arrp;
    EXPECT_EQ (arr[0].v, 0U);
    EXPECT_EQ (arr[2].v, 1U);
    EXPECT_EQ (arr[4].v, 2U);
}